

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_leafref(lyd_node_leaf_list *leaf,char *path,int req_inst,lyd_node **ret)

{
  int iVar1;
  lys_module *plVar2;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t i;
  lyxp_set xp_set;
  lyd_node **ret_local;
  int req_inst_local;
  char *path_local;
  lyd_node_leaf_list *leaf_local;
  
  memset(local_78,0,0x40);
  *ret = (lyd_node *)0x0;
  plVar2 = lyd_node_module((lyd_node *)leaf);
  iVar1 = lyxp_eval(path,(lyd_node *)leaf,LYXP_NODE_ELEM,plVar2,(lyxp_set *)local_78,0);
  if (iVar1 == 0) {
    if (local_78 == (undefined1  [4])0x1) {
      for (local_7c = 0; local_7c < (uint)xp_set.val._8_4_; local_7c = local_7c + 1) {
        if (((*(int *)(xp_set._8_8_ + (ulong)local_7c * 0x10 + 8) == 2) &&
            ((*(uint *)(**(long **)(xp_set._8_8_ + (ulong)local_7c * 0x10) + 0x38) & 0xc) != 0)) &&
           (leaf->value_str == *(char **)(*(long *)(xp_set._8_8_ + (ulong)local_7c * 0x10) + 0x38)))
        {
          *ret = *(lyd_node **)(xp_set._8_8_ + (ulong)local_7c * 0x10);
          break;
        }
      }
    }
    lyxp_set_cast((lyxp_set *)local_78,LYXP_SET_EMPTY,(lyd_node *)leaf,(lys_module *)0x0,0);
    if (*ret == (lyd_node *)0x0) {
      if (-1 < req_inst) {
        ly_vlog(leaf->schema->module->ctx,LYE_NOLEAFREF,LY_VLOG_LYD,leaf,path,leaf->value_str);
        return 1;
      }
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "There is no leafref \"%s\" with the value \"%s\", but it is not required.",path,
             leaf->value_str);
    }
    leaf_local._4_4_ = 0;
  }
  else {
    leaf_local._4_4_ = -1;
  }
  return leaf_local._4_4_;
}

Assistant:

static int
resolve_leafref(struct lyd_node_leaf_list *leaf, const char *path, int req_inst, struct lyd_node **ret)
{
    struct lyxp_set xp_set;
    uint32_t i;

    memset(&xp_set, 0, sizeof xp_set);
    *ret = NULL;

    /* syntax was already checked, so just evaluate the path using standard XPath */
    if (lyxp_eval(path, (struct lyd_node *)leaf, LYXP_NODE_ELEM, lyd_node_module((struct lyd_node *)leaf), &xp_set, 0) != EXIT_SUCCESS) {
        return -1;
    }

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if ((xp_set.val.nodes[i].type != LYXP_NODE_ELEM) || !(xp_set.val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                continue;
            }

            /* not that the value is already in canonical form since the parsers does the conversion,
             * so we can simply compare just the values */
            if (ly_strequal(leaf->value_str, ((struct lyd_node_leaf_list *)xp_set.val.nodes[i].node)->value_str, 1)) {
                /* we have the match */
                *ret = xp_set.val.nodes[i].node;
                break;
            }
        }
    }

    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, (struct lyd_node *)leaf, NULL, 0);

    if (!*ret) {
        /* reference not found */
        if (req_inst > -1) {
            LOGVAL(leaf->schema->module->ctx, LYE_NOLEAFREF, LY_VLOG_LYD, leaf, path, leaf->value_str);
            return EXIT_FAILURE;
        } else {
            LOGVRB("There is no leafref \"%s\" with the value \"%s\", but it is not required.", path, leaf->value_str);
        }
    }

    return EXIT_SUCCESS;
}